

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::DTDElementDecl::formatContentModel(DTDElementDecl *this)

{
  int iVar1;
  XMLCh *pXVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemoryManager *manager;
  undefined1 *toRep;
  XMLBuffer bufFmt;
  XMLBuffer local_40;
  
  iVar1 = *(int *)&(this->super_XMLElementDecl).field_0x2c;
  if (iVar1 == 0) {
    manager = (this->super_XMLElementDecl).fMemoryManager;
    toRep = XMLUni::fgEmptyString;
  }
  else {
    if (iVar1 != 1) {
      local_40.fMemoryManager = (this->super_XMLElementDecl).fMemoryManager;
      local_40.fIndex = 0;
      local_40.fCapacity = 0x3ff;
      local_40.fFullSize = 0;
      local_40.fUsed = false;
      local_40.fFullHandler = (XMLBufferFullHandler *)0x0;
      iVar1 = (*(local_40.fMemoryManager)->_vptr_MemoryManager[3])(local_40.fMemoryManager,0x800);
      local_40.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar1);
      *local_40.fBuffer = L'\0';
      iVar1 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[8])(this);
      ContentSpecNode::formatSpec((ContentSpecNode *)CONCAT44(extraout_var_00,iVar1),&local_40);
      local_40.fBuffer[local_40.fIndex] = L'\0';
      pXVar2 = XMLString::replicate(local_40.fBuffer,(this->super_XMLElementDecl).fMemoryManager);
      XMLBuffer::~XMLBuffer(&local_40);
      return pXVar2;
    }
    manager = (this->super_XMLElementDecl).fMemoryManager;
    toRep = (undefined1 *)0x343fd0;
  }
  pXVar2 = XMLString::replicate((XMLCh *)toRep,manager);
  return pXVar2;
}

Assistant:

XMLCh* DTDElementDecl::formatContentModel() const
{
    XMLCh* newValue = 0;
    if (fModelType == Any)
    {
        newValue = XMLString::replicate(XMLUni::fgAnyString, getMemoryManager());
    }
     else if (fModelType == Empty)
    {
        newValue = XMLString::replicate(XMLUni::fgEmptyString, getMemoryManager());
    }
     else
    {
        //
        //  Use a temp XML buffer to format into. Content models could be
        //  pretty long, but very few will be longer than one K. The buffer
        //  will expand to handle the more pathological ones.
        //
        XMLBuffer bufFmt(1023, getMemoryManager());
        getContentSpec()->formatSpec(bufFmt);
        newValue = XMLString::replicate(bufFmt.getRawBuffer(), getMemoryManager());
    }
    return newValue;
}